

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

int __thiscall Cleaner::CleanTargets(Cleaner *this,int target_count,char **targets)

{
  int iVar1;
  StringPiece path;
  Node *target;
  ulong uVar2;
  string target_name;
  uint64_t slash_bits;
  string local_60;
  char **local_40;
  allocator<char> local_38 [8];
  
  this->status_ = 0;
  this->cleaned_files_count_ = 0;
  local_40 = targets;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->removed_)._M_t);
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::clear(&(this->cleaned_)._M_t);
  PrintHeader(this);
  LoadDyndeps(this);
  if (0 < target_count) {
    uVar2 = 0;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,local_40[uVar2],local_38);
      if (local_60._M_string_length == 0) {
        Error("failed to canonicalize \'\': empty path");
        this->status_ = 1;
      }
      else {
        CanonicalizePath(&local_60,(uint64_t *)local_38);
        path.len_ = local_60._M_string_length;
        path.str_ = local_60._M_dataplus._M_p;
        target = State::LookupNode(this->state_,path);
        if (target == (Node *)0x0) {
          Error("unknown target \'%s\'",local_60._M_dataplus._M_p);
          this->status_ = 1;
        }
        else {
          iVar1 = *(int *)this->config_;
          if ((iVar1 != 0) && ((iVar1 == 3 || (this->config_[4] == (BuildConfig)0x1)))) {
            printf("Target %s\n",local_60._M_dataplus._M_p);
          }
          DoCleanTarget(this,target);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)target_count != uVar2);
  }
  if (*(int *)this->config_ != 0) {
    printf("%d files.\n",(ulong)(uint)this->cleaned_files_count_);
  }
  return this->status_;
}

Assistant:

int Cleaner::CleanTargets(int target_count, char* targets[]) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (int i = 0; i < target_count; ++i) {
    string target_name = targets[i];
    if (target_name.empty()) {
      Error("failed to canonicalize '': empty path");
      status_ = 1;
      continue;
    }
    uint64_t slash_bits;
    CanonicalizePath(&target_name, &slash_bits);
    Node* target = state_->LookupNode(target_name);
    if (target) {
      if (IsVerbose())
        printf("Target %s\n", target_name.c_str());
      DoCleanTarget(target);
    } else {
      Error("unknown target '%s'", target_name.c_str());
      status_ = 1;
    }
  }
  PrintFooter();
  return status_;
}